

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

int anon_unknown.dwarf_17f5ef::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  lVar2 = (anonymous_namespace)::MyItem::s_current_sort_specs[1];
  if (0 < (long)(int)lVar2) {
    lVar1 = *(anonymous_namespace)::MyItem::s_current_sort_specs;
    lVar4 = 0;
    do {
      switch(*(undefined4 *)(lVar1 + lVar4)) {
      case 0:
        iVar3 = *lhs - *rhs;
        break;
      case 1:
      case 4:
        iVar3 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                      ,0xde0,
                      "static int (anonymous namespace)::MyItem::CompareWithSortSpecs(const void *, const void *)"
                     );
      case 3:
        iVar3 = *(int *)((long)lhs + 0x10) - *(int *)((long)rhs + 0x10);
      }
      if (0 < iVar3) {
        bVar5 = *(char *)(lVar1 + 8 + lVar4) == '\x01';
LAB_001fcecd:
        return (uint)bVar5 * 2 + -1;
      }
      if (iVar3 < 0) {
        bVar5 = *(char *)(lVar1 + 8 + lVar4) != '\x01';
        goto LAB_001fcecd;
      }
      lVar4 = lVar4 + 0xc;
    } while ((long)(int)lVar2 * 0xc != lVar4);
  }
  return *lhs - *rhs;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }